

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::update_marginal(data *sm,example *ec)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  float *pfVar7;
  loss_function *plVar8;
  vw *pvVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  byte *pbVar12;
  uint64_t *puVar13;
  uint64_t uVar14;
  ulong *puVar15;
  float *pfVar16;
  bool bVar17;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar18;
  float fVar19;
  uint64_t key;
  key_type local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  features *local_90;
  byte *local_88;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  uint64_t local_78;
  example *local_70;
  vw *local_68;
  double local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  features *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_68 = sm->all;
  puVar13 = &(local_68->weights).dense_weights._weight_mask;
  if ((local_68->weights).sparse != false) {
    puVar13 = &(local_68->weights).sparse_weights._weight_mask;
  }
  if (sm->unweighted_marginals == false) {
    local_48 = ec->weight;
  }
  else {
    local_48 = 1.0;
  }
  local_c8 = ZEXT416((uint)local_48);
  local_88 = (ec->super_example_predict).indices._begin;
  pbVar12 = (ec->super_example_predict).indices._end;
  if (local_88 != pbVar12) {
    uVar14 = *puVar13;
    fVar1 = (ec->l).simple.label;
    local_50 = sm->temp;
    local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&sm->marginals;
    local_80 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&sm->expert_state;
    local_60 = (double)local_48;
    local_90 = local_50;
    local_78 = uVar14;
    local_70 = ec;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      bVar6 = *local_88;
      if (sm->id_features[bVar6] == true) {
        pfVar16 = local_50[bVar6].values._begin;
        pfVar7 = local_50[bVar6].values._end;
        if (pfVar16 + 1 != pfVar7 && pfVar16 != pfVar7) {
          local_50 = local_50 + bVar6;
          puVar15 = (local_50->indicies)._begin + 1;
          pfVar16 = pfVar16 + 3;
          do {
            local_d0 = (*puVar15 & uVar14) + (ec->super_example_predict).ft_offset;
            pmVar10 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_58,&local_d0);
            if (sm->compete == true) {
              pmVar11 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_80,&local_d0);
              pvVar9 = local_68;
              local_b8 = ZEXT416((uint)sm->alg_loss);
              (*local_68->loss->_vptr_loss_function[1])
                        ((float)(pmVar10->first / pmVar10->second),fVar1,local_68->loss,local_68->sd
                        );
              ec = local_70;
              local_b8._0_4_ = (float)local_b8._0_4_ - extraout_XMM0_Da;
              local_a8 = ZEXT416((uint)sm->alg_loss);
              plVar8 = pvVar9->loss;
              (*plVar8->_vptr_loss_function[1])(sm->feature_pred,fVar1,plVar8,pvVar9->sd);
              local_a8._0_4_ = (float)local_a8._0_4_ - extraout_XMM0_Da_00;
              uVar2 = (pmVar11->first).regret;
              uVar4 = (pmVar11->first).abs_regret;
              fVar18 = (float)local_b8._0_4_ * local_48 + (float)uVar2;
              fVar19 = (float)local_b8._0_4_ * (float)local_b8._0_4_ * fStack_44 + (float)uVar4;
              (pmVar11->first).regret = fVar18;
              (pmVar11->first).abs_regret = fVar19;
              fVar18 = get_adanormalhedge_weights(fVar18,fVar19);
              (pmVar11->first).weight = fVar18;
              uVar3 = (pmVar11->second).regret;
              uVar5 = (pmVar11->second).abs_regret;
              fVar18 = (float)local_a8._0_4_ * local_48 + (float)uVar3;
              fVar19 = (float)local_a8._0_4_ * (float)local_a8._0_4_ * fStack_44 + (float)uVar5;
              (pmVar11->second).regret = fVar18;
              (pmVar11->second).abs_regret = fVar19;
              fVar18 = get_adanormalhedge_weights(fVar18,fVar19);
              (pmVar11->second).weight = fVar18;
              uVar14 = local_78;
            }
            pmVar10->first =
                 (1.0 - (double)sm->decay) * pmVar10->first +
                 (double)((ec->l).simple.label * (float)local_c8._0_4_);
            pmVar10->second = (1.0 - (double)sm->decay) * pmVar10->second + local_60;
            pfVar7 = (local_50->values)._end;
            if (pfVar16 + -1 == pfVar7) break;
            puVar15 = puVar15 + 2;
            bVar17 = pfVar16 != pfVar7;
            pfVar16 = pfVar16 + 2;
          } while (bVar17);
          pbVar12 = (ec->super_example_predict).indices._end;
          local_50 = local_90;
        }
      }
      local_88 = local_88 + 1;
    } while (local_88 != pbVar12);
  }
  return;
}

Assistant:

void update_marginal(data& sm, example& ec)
{
  vw& all = *sm.all;
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  float weight = ec.weight;
  if (sm.unweighted_marginals)
    weight = 1.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        if (++j == sm.temp[n].end())
          break;

        uint64_t second_index = j.index() & mask;
        uint64_t key = second_index + ec.ft_offset;
        marginal& m = sm.marginals[key];

        if (sm.compete)  // now update weights, before updating marginals
        {
          expert_pair& e = sm.expert_state[key];
          float regret1 = sm.alg_loss - all.loss->getLoss(all.sd, (float)(m.first / m.second), label);
          float regret2 = sm.alg_loss - all.loss->getLoss(all.sd, sm.feature_pred, label);

          e.first.regret += regret1 * weight;
          e.first.abs_regret += regret1 * regret1 * weight;  // fabs(regret1);
          e.first.weight = get_adanormalhedge_weights(e.first.regret, e.first.abs_regret);
          e.second.regret += regret2 * weight;
          e.second.abs_regret += regret2 * regret2 * weight;  // fabs(regret2);
          e.second.weight = get_adanormalhedge_weights(e.second.regret, e.second.abs_regret);
        }

        m.first = m.first * (1. - sm.decay) + ec.l.simple.label * weight;
        m.second = m.second * (1. - sm.decay) + weight;
      }
  }
}